

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O3

bool __thiscall SuperCardPro::WriteExact(SuperCardPro *this,void *buf,int len)

{
  bool bVar1;
  uint in_EAX;
  int iVar2;
  uint uVar3;
  int bytes_written;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  if (0 < len) {
    do {
      iVar2 = (*this->_vptr_SuperCardPro[3])(this,buf,(ulong)(uint)len,(long)&uStack_28 + 4);
      if ((char)iVar2 == '\0') {
        return false;
      }
      buf = (void *)((long)buf + (long)uStack_28._4_4_);
      uVar3 = len - uStack_28._4_4_;
      bVar1 = uStack_28._4_4_ <= len;
      len = uVar3;
    } while (uVar3 != 0 && bVar1);
  }
  usleep(5000);
  return true;
}

Assistant:

bool SuperCardPro::WriteExact(const void* buf, int len)
{
    auto p = reinterpret_cast<const uint8_t*>(buf);
    auto bytes_written = 0;

    while (len > 0)
    {
        if (!Write(p, len, &bytes_written))
            return false;

        len -= bytes_written;
        p += bytes_written;
    }

#ifndef _WIN32
    // ToDo: find why the Raspberry Pi needs this.
    usleep(5000);
#endif

    return true;
}